

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool google::protobuf::internal::IsMatchingCType(FieldDescriptor *field,int ctype)

{
  CppStringType CVar1;
  
  CVar1 = FieldDescriptor::cpp_string_type(field);
  if (CVar1 - kView < 3) {
    return *(int *)(&DAT_00415974 + (ulong)(CVar1 - kView) * 4) == ctype;
  }
  Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
              ,0xbc);
}

Assistant:

bool IsMatchingCType(const FieldDescriptor* field, int ctype) {
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord:
      return ctype == FieldOptions::CORD;
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString:
      return ctype == FieldOptions::STRING;
  }
  internal::Unreachable();
}